

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O2

string * leveldb::anon_unknown_7::GetDirName(string *__return_storage_ptr__,string *filename)

{
  long lVar1;
  allocator local_11;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filename,0x12226f);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetDirName(const std::string& filename) {
  size_t found = filename.find_last_of("/\\");
  if (found == std::string::npos) {
    return "";
  } else {
    return filename.substr(0, found);
  }
}